

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerQueryFuncs(Builtins *this)

{
  shared_ptr<slang::ast::builtins::ArrayDimensionFunction> *in_stack_fffffffffffffdb8;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffdc0;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  bool *__args_1;
  KnownSystemName *__args;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffe50;
  shared_ptr<slang::ast::SystemSubroutine> *subroutine;
  Builtins *in_stack_fffffffffffffe58;
  Builtins *this_01;
  shared_ptr<slang::ast::SystemSubroutine> local_180 [2];
  undefined1 local_15d;
  undefined4 local_15c;
  bool local_138 [16];
  KnownSystemName local_128 [52];
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  
  std::make_shared<slang::ast::builtins::BitsFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::BitsFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::BitsFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7990b5);
  std::shared_ptr<slang::ast::builtins::BitsFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::BitsFunction> *)0x7990c2);
  subroutine = &local_58;
  std::make_shared<slang::ast::builtins::TypenameFunction>();
  this_01 = (Builtins *)&stack0xffffffffffffffb8;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::TypenameFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::TypenameFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x799118);
  std::shared_ptr<slang::ast::builtins::TypenameFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::TypenameFunction> *)0x799125);
  std::make_shared<slang::ast::builtins::IsUnboundedFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::IsUnboundedFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::IsUnboundedFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x79917b);
  std::shared_ptr<slang::ast::builtins::IsUnboundedFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::IsUnboundedFunction> *)0x799188);
  std::make_shared<slang::ast::builtins::LowFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::LowFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::LowFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7991d8);
  std::shared_ptr<slang::ast::builtins::LowFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::LowFunction> *)0x7991e5);
  std::make_shared<slang::ast::builtins::HighFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::HighFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::HighFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x79922f);
  std::shared_ptr<slang::ast::builtins::HighFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::HighFunction> *)0x79923c);
  std::make_shared<slang::ast::builtins::LeftFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::LeftFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::LeftFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x799286);
  std::shared_ptr<slang::ast::builtins::LeftFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::LeftFunction> *)0x799293);
  std::make_shared<slang::ast::builtins::RightFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RightFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::RightFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7992dd);
  std::shared_ptr<slang::ast::builtins::RightFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RightFunction> *)0x7992ea);
  std::make_shared<slang::ast::builtins::SizeFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::shared_ptr<slang::ast::builtins::SizeFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::SizeFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x799334);
  std::shared_ptr<slang::ast::builtins::SizeFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::SizeFunction> *)0x799341);
  __args_1 = local_138;
  std::make_shared<slang::ast::builtins::IncrementFunction>();
  __args = local_128;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::IncrementFunction,void>
            (in_stack_fffffffffffffdc0,
             (shared_ptr<slang::ast::builtins::IncrementFunction> *)in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x79938b);
  std::shared_ptr<slang::ast::builtins::IncrementFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::IncrementFunction> *)0x799398);
  local_15c = 10;
  local_15d = 0;
  std::
  make_shared<slang::ast::builtins::ArrayDimensionFunction,slang::parsing::KnownSystemName,bool>
            (__args,__args_1);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ArrayDimensionFunction,void>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x799405);
  std::shared_ptr<slang::ast::builtins::ArrayDimensionFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ArrayDimensionFunction> *)0x799412);
  this_00 = local_180;
  std::
  make_shared<slang::ast::builtins::ArrayDimensionFunction,slang::parsing::KnownSystemName,bool>
            (__args,__args_1);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::ArrayDimensionFunction,void>(this_00,in_stack_fffffffffffffdb8);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x79947f);
  std::shared_ptr<slang::ast::builtins::ArrayDimensionFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::ArrayDimensionFunction> *)0x79948c);
  return;
}

Assistant:

void Builtins::registerQueryFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name) addSystemSubroutine(std::make_shared<name##Function>())
    REGISTER(Bits);
    REGISTER(Typename);
    REGISTER(IsUnbounded);
    REGISTER(Low);
    REGISTER(High);
    REGISTER(Left);
    REGISTER(Right);
    REGISTER(Size);
    REGISTER(Increment);
#undef REGISTER

    addSystemSubroutine(
        std::make_shared<ArrayDimensionFunction>(KnownSystemName::Dimensions, false));
    addSystemSubroutine(
        std::make_shared<ArrayDimensionFunction>(KnownSystemName::UnpackedDimensions, true));
}